

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O0

void __thiscall Json::Value::Value(Value *this,Value *other)

{
  Value *in_RSI;
  Value *in_RDI;
  
  initBasic(in_RDI,nullValue,false);
  swap(in_RSI,in_RDI);
  return;
}

Assistant:

Value::Value(Value&& other) {
  initBasic(nullValue);
  swap(other);
}